

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txreconciliation_tests.cpp
# Opt level: O0

void __thiscall
txreconciliation_tests::IsPeerRegisteredTest::test_method(IsPeerRegisteredTest *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  NodeId peer_id0;
  TxReconciliationTracker tracker;
  char *in_stack_fffffffffffffcd8;
  lazy_ostream *in_stack_fffffffffffffce0;
  assertion_result *in_stack_fffffffffffffce8;
  NodeId in_stack_fffffffffffffcf0;
  TxReconciliationTracker *in_stack_fffffffffffffcf8;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  lazy_ostream *in_stack_fffffffffffffd08;
  undefined7 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd17;
  unit_test_log_t *in_stack_fffffffffffffd18;
  unit_test_log_t *this_00;
  const_string local_248 [2];
  lazy_ostream local_228;
  const_string local_1d0 [2];
  lazy_ostream local_1b0 [2];
  lazy_ostream local_158;
  undefined1 local_140 [64];
  const_string local_100 [2];
  lazy_ostream local_e0 [2];
  assertion_result local_c0 [2];
  const_string local_88 [2];
  lazy_ostream local_68 [2];
  assertion_result local_48 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  TxReconciliationTracker::TxReconciliationTracker
            ((TxReconciliationTracker *)0xb963a6,
             (uint32_t)((ulong)in_stack_fffffffffffffcd8 >> 0x20));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffce8,
               (pointer)in_stack_fffffffffffffce0,(unsigned_long)in_stack_fffffffffffffcd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffd18,
               (const_string *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
               (size_t)in_stack_fffffffffffffd08,
               (const_string *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    TxReconciliationTracker::IsPeerRegistered
              ((TxReconciliationTracker *)in_stack_fffffffffffffce8,
               (NodeId)in_stack_fffffffffffffce0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffce8,SUB81((ulong)in_stack_fffffffffffffce0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffce8,
               (pointer)in_stack_fffffffffffffce0,(unsigned_long)in_stack_fffffffffffffcd8);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffce0,(basic_cstring<const_char> *)in_stack_fffffffffffffcd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffce8,
               (pointer)in_stack_fffffffffffffce0,(unsigned_long)in_stack_fffffffffffffcd8);
    in_stack_fffffffffffffcd8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_48,local_68,local_88,0x49,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffcd8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffcd8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  TxReconciliationTracker::PreRegisterPeer
            ((TxReconciliationTracker *)in_stack_fffffffffffffce8,(NodeId)in_stack_fffffffffffffce0)
  ;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffce8,
               (pointer)in_stack_fffffffffffffce0,(unsigned_long)in_stack_fffffffffffffcd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffd18,
               (const_string *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
               (size_t)in_stack_fffffffffffffd08,
               (const_string *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    TxReconciliationTracker::IsPeerRegistered
              ((TxReconciliationTracker *)in_stack_fffffffffffffce8,
               (NodeId)in_stack_fffffffffffffce0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffce8,SUB81((ulong)in_stack_fffffffffffffce0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffce8,
               (pointer)in_stack_fffffffffffffce0,(unsigned_long)in_stack_fffffffffffffcd8);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffce0,(basic_cstring<const_char> *)in_stack_fffffffffffffcd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffce8,
               (pointer)in_stack_fffffffffffffce0,(unsigned_long)in_stack_fffffffffffffcd8);
    in_stack_fffffffffffffcd8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c0,local_e0,local_100,0x4b,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffcd8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffcd8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffce8,
               (pointer)in_stack_fffffffffffffce0,(unsigned_long)in_stack_fffffffffffffcd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffd18,
               (const_string *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
               (size_t)in_stack_fffffffffffffd08,
               (const_string *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffce0,(char (*) [1])in_stack_fffffffffffffcd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffce8,
               (pointer)in_stack_fffffffffffffce0,(unsigned_long)in_stack_fffffffffffffcd8);
    local_158._vptr_lazy_ostream._4_4_ =
         TxReconciliationTracker::RegisterPeer
                   (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                    SUB81((ulong)in_stack_fffffffffffffce8 >> 0x38,0),
                    (uint32_t)in_stack_fffffffffffffce8,(uint64_t)in_stack_fffffffffffffce0);
    local_158._vptr_lazy_ostream._0_4_ = 1;
    in_stack_fffffffffffffce8 = (assertion_result *)0x1cc67a4;
    in_stack_fffffffffffffce0 = &local_158;
    in_stack_fffffffffffffcd8 = "tracker.RegisterPeer(peer_id0, true, 1, 1)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ReconciliationRegisterResult,ReconciliationRegisterResult>
              (local_140,&local_158.m_empty,0x4d,2,2,
               (undefined1 *)((long)&local_158._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffcd8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffce8,
               (pointer)in_stack_fffffffffffffce0,(unsigned_long)in_stack_fffffffffffffcd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffd18,
               (const_string *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
               (size_t)in_stack_fffffffffffffd08,
               (const_string *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    TxReconciliationTracker::IsPeerRegistered
              ((TxReconciliationTracker *)in_stack_fffffffffffffce8,
               (NodeId)in_stack_fffffffffffffce0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffce8,SUB81((ulong)in_stack_fffffffffffffce0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffce8,
               (pointer)in_stack_fffffffffffffce0,(unsigned_long)in_stack_fffffffffffffcd8);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffce0,(basic_cstring<const_char> *)in_stack_fffffffffffffcd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffce8,
               (pointer)in_stack_fffffffffffffce0,(unsigned_long)in_stack_fffffffffffffcd8);
    in_stack_fffffffffffffcd8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffffe70,local_1b0,local_1d0,0x4e,CHECK,
               CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffcd8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffcd8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  TxReconciliationTracker::ForgetPeer((TxReconciliationTracker *)in_stack_fffffffffffffcd8,0xb96968)
  ;
  do {
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffce8,
               (pointer)in_stack_fffffffffffffce0,(unsigned_long)in_stack_fffffffffffffcd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,(const_string *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10)
               ,(size_t)in_stack_fffffffffffffd08,
               (const_string *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    in_stack_fffffffffffffd17 =
         TxReconciliationTracker::IsPeerRegistered
                   ((TxReconciliationTracker *)in_stack_fffffffffffffce8,
                    (NodeId)in_stack_fffffffffffffce0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffce8,SUB81((ulong)in_stack_fffffffffffffce0 >> 0x38,0));
    in_stack_fffffffffffffd08 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffce8,
               (pointer)in_stack_fffffffffffffce0,(unsigned_long)in_stack_fffffffffffffcd8);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffce0,(basic_cstring<const_char> *)in_stack_fffffffffffffcd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffce8,
               (pointer)in_stack_fffffffffffffce0,(unsigned_long)in_stack_fffffffffffffcd8);
    in_stack_fffffffffffffcd8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffffdf8,&local_228,local_248,0x51,CHECK,
               CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffcd8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffcd8);
    in_stack_fffffffffffffd07 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffd07);
  TxReconciliationTracker::~TxReconciliationTracker
            ((TxReconciliationTracker *)in_stack_fffffffffffffcd8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(IsPeerRegisteredTest)
{
    TxReconciliationTracker tracker(TXRECONCILIATION_VERSION);
    NodeId peer_id0 = 0;

    BOOST_REQUIRE(!tracker.IsPeerRegistered(peer_id0));
    tracker.PreRegisterPeer(peer_id0);
    BOOST_REQUIRE(!tracker.IsPeerRegistered(peer_id0));

    BOOST_REQUIRE_EQUAL(tracker.RegisterPeer(peer_id0, true, 1, 1), ReconciliationRegisterResult::SUCCESS);
    BOOST_CHECK(tracker.IsPeerRegistered(peer_id0));

    tracker.ForgetPeer(peer_id0);
    BOOST_CHECK(!tracker.IsPeerRegistered(peer_id0));
}